

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

Time __thiscall
helics::TimeCoordinator::updateTimeBlocks(TimeCoordinator *this,int32_t blockId,Time newTime)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  pointer ppVar4;
  baseType in_RDX;
  undefined4 in_ESI;
  __normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
  *in_RDI;
  __normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
  res;
  __normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
  blk;
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  anon_class_4_1_82131168_for__M_pred in_stack_ffffffffffffff9c;
  __normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
  local_50;
  pair<TimeRepresentation<count_time<9,_long>_>,_int> *local_48;
  undefined4 local_3c;
  pair<TimeRepresentation<count_time<9,_long>_>,_int> *local_38;
  pair<TimeRepresentation<count_time<9,_long>_>,_int> *local_30;
  __normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
  local_28;
  undefined4 local_1c;
  baseType local_10;
  
  local_1c = in_ESI;
  local_10 = in_RDX;
  local_30 = (pair<TimeRepresentation<count_time<9,_long>_>,_int> *)
             std::
             vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
             ::begin(in_stack_ffffffffffffff88);
  local_38 = (pair<TimeRepresentation<count_time<9,_long>_>,_int> *)
             std::
             vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
             ::end(in_stack_ffffffffffffff88);
  local_3c = local_1c;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<std::pair<TimeRepresentation<count_time<9,long>>,int>*,std::vector<std::pair<TimeRepresentation<count_time<9,long>>,int>,std::allocator<std::pair<TimeRepresentation<count_time<9,long>>,int>>>>,helics::TimeCoordinator::updateTimeBlocks(int,TimeRepresentation<count_time<9,long>>)::__0>
                       (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff9c);
  local_48 = (pair<TimeRepresentation<count_time<9,_long>_>,_int> *)
             std::
             vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
             ::end(in_stack_ffffffffffffff88);
  bVar1 = __gnu_cxx::
          operator==<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                    (in_RDI,(__normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                             *)in_stack_ffffffffffffff88);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::
    vector<std::pair<TimeRepresentation<count_time<9,long>>,int>,std::allocator<std::pair<TimeRepresentation<count_time<9,long>>,int>>>
    ::emplace_back<TimeRepresentation<count_time<9,long>>&,int&>
              ((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                *)in_stack_ffffffffffffffa0._M_current,
               (TimeRepresentation<count_time<9,_long>_> *)
               CONCAT44(in_stack_ffffffffffffff9c.blockId,in_stack_ffffffffffffff98),(int *)in_RDI);
  }
  else {
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
             ::operator->(&local_28);
    (ppVar4->first).internalTimeCode = local_10;
  }
  iVar2 = std::
          vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
          ::begin(in_stack_ffffffffffffff88);
  iVar3 = std::
          vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
          ::end(in_stack_ffffffffffffff88);
  local_50 = std::
             min_element<__gnu_cxx::__normal_iterator<std::pair<TimeRepresentation<count_time<9,long>>,int>*,std::vector<std::pair<TimeRepresentation<count_time<9,long>>,int>,std::allocator<std::pair<TimeRepresentation<count_time<9,long>>,int>>>>,helics::TimeCoordinator::updateTimeBlocks(int,TimeRepresentation<count_time<9,long>>)::__1>
                       (iVar2._M_current,iVar3._M_current);
  ppVar4 = __gnu_cxx::
           __normal_iterator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
           ::operator->(&local_50);
  return (Time)(ppVar4->first).internalTimeCode;
}

Assistant:

Time TimeCoordinator::updateTimeBlocks(int32_t blockId, Time newTime)
{
    auto blk = std::find_if(timeBlocks.begin(), timeBlocks.end(), [blockId](const auto& block) {
        return (block.second == blockId);
    });
    if (blk != timeBlocks.end()) {
        blk->first = newTime;
    } else {
        timeBlocks.emplace_back(newTime, blockId);
    }
    auto res = std::min_element(timeBlocks.begin(),
                                timeBlocks.end(),
                                [](const auto& blk1, const auto& blk2) {
                                    return (blk1.first < blk2.first);
                                });
    return res->first;
}